

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

void wprefs(settings_w *sesskey,char *name,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *value;
  long lVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  
  if (nvals < 1) {
    iVar7 = 0;
    value = (char *)safemalloc(1,1,0);
    pcVar6 = value;
  }
  else {
    iVar5 = 0;
    iVar7 = 0;
    do {
      iVar2 = conf_get_int_int(conf,primary,iVar5);
      lVar4 = 0;
      do {
        if (*(int *)((long)&mapping->v + lVar4) == iVar2) {
          pcVar6 = *(char **)((long)&mapping->s + lVar4);
          if (pcVar6 != (char *)0x0) {
            sVar3 = strlen(pcVar6);
            iVar7 = (uint)(0 < iVar7) + iVar7 + (int)sVar3;
          }
          break;
        }
        lVar4 = lVar4 + 0x18;
      } while ((ulong)(uint)nvals * 0x18 != lVar4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != nvals);
    value = (char *)safemalloc((long)(iVar7 + 1),1,0);
    pcVar6 = value;
    if (0 < nvals) {
      iVar5 = 0;
      do {
        iVar2 = conf_get_int_int(conf,primary,iVar5);
        lVar4 = 0;
        do {
          if (*(int *)((long)&mapping->v + lVar4) == iVar2) {
            if (*(long *)((long)&mapping->s + lVar4) != 0) {
              pcVar1 = " \t";
              if (value < pcVar6) {
                pcVar1 = "%s,";
              }
              iVar2 = sprintf(pcVar6,"%s%s",pcVar1 + 2);
              pcVar6 = pcVar6 + iVar2;
            }
            break;
          }
          lVar4 = lVar4 + 0x18;
        } while ((ulong)(uint)nvals * 0x18 != lVar4);
        iVar5 = iVar5 + 1;
      } while (iVar5 != nvals);
    }
  }
  if ((long)pcVar6 - (long)value != (long)iVar7) {
    __assert_fail("p - buf == maxlen",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c",
                  0x1d5,
                  "void wprefs(settings_w *, const char *, const struct keyvalwhere *, int, Conf *, int)"
                 );
  }
  *pcVar6 = '\0';
  write_setting_s(sesskey,name,value);
  safefree(value);
  return;
}

Assistant:

static void wprefs(settings_w *sesskey, const char *name,
                   const struct keyvalwhere *mapping, int nvals,
                   Conf *conf, int primary)
{
    char *buf, *p;
    int i, maxlen;

    for (maxlen = i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            maxlen += (maxlen > 0 ? 1 : 0) + strlen(s);
        }
    }

    buf = snewn(maxlen + 1, char);
    p = buf;

    for (i = 0; i < nvals; i++) {
        const char *s = val2key(mapping, nvals,
                                conf_get_int_int(conf, primary, i));
        if (s) {
            p += sprintf(p, "%s%s", (p > buf ? "," : ""), s);
        }
    }

    assert(p - buf == maxlen);
    *p = '\0';

    write_setting_s(sesskey, name, buf);

    sfree(buf);
}